

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O3

cupdlp_retcode PDHG_Solve(CUPDLPwork *pdhg)

{
  CUPDLPproblem *pCVar1;
  CUPDLPsettings *pCVar2;
  CUPDLPresobj *pCVar3;
  CUPDLPiterates *pCVar4;
  CUPDLPtimers *pCVar5;
  CUPDLPscaling *pCVar6;
  CUPDLPtimers *pCVar7;
  CUPDLPvec *pCVar8;
  CUPDLPvec *pCVar9;
  CUPDLPvec *pCVar10;
  byte bVar11;
  cupdlp_bool cVar12;
  cupdlp_retcode cVar13;
  int iVar14;
  termination_iterate tVar15;
  long lVar16;
  int iVar17;
  char *pcVar18;
  termination_code tVar19;
  long lVar20;
  bool bVar21;
  long lVar22;
  double dVar23;
  long local_60;
  long local_58;
  long local_50;
  
  pCVar1 = pdhg->problem;
  pCVar2 = pdhg->settings;
  pCVar3 = pdhg->resobj;
  pCVar4 = pdhg->iterates;
  pCVar5 = pdhg->timers;
  pCVar6 = pdhg->scaling;
  pCVar5->nIter = 0;
  dVar23 = getTimeStamp();
  pCVar5->dSolvingBeg = dVar23;
  PDHG_Init_Data(pdhg);
  cVar13 = PDHG_Init_Step_Sizes(pdhg);
  if (cVar13 != 0) {
    return 1;
  }
  PDHG_Init_Variables(pdhg);
  pCVar5->nIter = 0;
  if (0 < pCVar2->nIterLim) {
    iVar17 = 0x32;
    do {
      pCVar7 = pdhg->timers;
      dVar23 = getTimeStamp();
      pCVar7->dSolvingTime = dVar23 - pCVar7->dSolvingBeg;
      iVar14 = pCVar5->nIter;
      if ((((iVar14 < 10) || (iVar14 == pCVar2->nIterLim + -1)) ||
          (((uint)(iVar14 * -0x33333333) >> 3 | iVar14 * -0x60000000) < 0x6666667)) ||
         (pCVar2->dTimeLim <= pCVar5->dSolvingTime && pCVar5->dSolvingTime != pCVar2->dTimeLim)) {
        bVar21 = true;
        if ((iVar14 % (pCVar2->nLogInterval * 0x28) != 0) && (iVar14 != pCVar2->nIterLim + -1)) {
          bVar21 = pCVar2->dTimeLim <= pCVar5->dSolvingTime &&
                   pCVar5->dSolvingTime != pCVar2->dTimeLim;
        }
        iVar14 = pdhg->settings->nLogLevel;
        PDHG_Compute_Average_Iterate(pdhg);
        PDHG_Compute_Residuals(pdhg);
        PDHG_Compute_Infeas_Residuals(pdhg);
        if ((0 < iVar14) && (bVar21 != false)) {
          if ((1 < iVar14) || (iVar17 == 0x32)) {
            printf("%9s  %15s  %15s   %8s  %10s  %8s %7s\n","Iter","Primal.Obj","Dual.Obj","Gap",
                   "Primal.Inf","Dual.Inf","Time");
            iVar17 = 0;
            if (1 < iVar14) {
              PDHG_Print_Iter(pdhg);
              iVar17 = 0;
            }
          }
          PDHG_Print_Iter_Average(pdhg);
          iVar17 = iVar17 + 1;
        }
        bVar11 = 1 < iVar14 & bVar21;
        cVar12 = PDHG_Check_Termination(pdhg,(uint)bVar11);
        tVar19 = OPTIMAL;
        if (cVar12) {
          tVar15 = LAST_ITERATE;
        }
        else {
          if ((pdhg->settings->iInfNormAbsLocalTermination != 0) ||
             (cVar12 = PDHG_Check_Termination_Average(pdhg,(uint)bVar11), !cVar12)) {
            tVar19 = PDHG_Check_Infeasibility(pdhg,0);
            if (tVar19 == INFEASIBLE_OR_UNBOUNDED) {
              tVar19 = INFEASIBLE_OR_UNBOUNDED;
            }
            else {
              tVar19 = TIMELIMIT_OR_ITERLIMIT;
              if ((pCVar5->dSolvingTime < pCVar2->dTimeLim ||
                   pCVar5->dSolvingTime == pCVar2->dTimeLim) &&
                 (pCVar5->nIter < pCVar2->nIterLim + -1)) {
                PDHG_Restart_Iterate(pdhg);
                goto LAB_00387534;
              }
            }
            goto LAB_0038769c;
          }
          iVar17 = pdhg->timers->nIter % 2;
          pCVar8 = pCVar4->y[iVar17];
          pCVar9 = pCVar4->ax[iVar17];
          pCVar10 = pCVar4->aty[iVar17];
          memcpy(pCVar4->x[iVar17]->data,pCVar4->xAverage->data,(long)pCVar1->nCols << 3);
          memcpy(pCVar8->data,pCVar4->yAverage->data,(long)pCVar1->nRows << 3);
          memcpy(pCVar9->data,pCVar4->axAverage->data,(long)pCVar1->nRows << 3);
          memcpy(pCVar10->data,pCVar4->atyAverage->data,(long)pCVar1->nCols << 3);
          memcpy(pCVar3->dSlackPos,pCVar3->dSlackPosAverage,(long)pCVar1->nCols << 3);
          memcpy(pCVar3->dSlackNeg,pCVar3->dSlackNegAverage,(long)pCVar1->nCols << 3);
          tVar15 = AVERAGE_ITERATE;
        }
        pCVar3->termIterate = tVar15;
LAB_0038769c:
        pCVar3->termCode = tVar19;
        break;
      }
LAB_00387534:
      cVar13 = PDHG_Update_Iterate(pdhg);
      if (cVar13 == 1) {
        tVar19 = TIMELIMIT_OR_ITERLIMIT;
        goto LAB_0038769c;
      }
      iVar14 = pCVar5->nIter + 1;
      pCVar5->nIter = iVar14;
    } while (iVar14 < pCVar2->nIterLim);
  }
  iVar17 = pdhg->settings->nLogLevel;
  if (iVar17 < 1) {
    return 0;
  }
  if (iVar17 != 1) {
    printf("%9s  %15s  %15s   %8s  %10s  %8s %7s\n","Iter","Primal.Obj","Dual.Obj","Gap",
           "Primal.Inf","Dual.Inf","Time");
    PDHG_Print_Iter(pdhg);
  }
  PDHG_Print_Iter_Average(pdhg);
  if (pdhg->settings->nLogLevel < 1) {
    return 0;
  }
  putchar(10);
  printf("%-27s ","Solving information:");
  tVar19 = pCVar3->termCode;
  if (tVar19 == TIMELIMIT_OR_ITERLIMIT) {
    if (pCVar2->dTimeLim <= pCVar5->dSolvingTime && pCVar5->dSolvingTime != pCVar2->dTimeLim) {
      pcVar18 = "Time limit reached.";
      goto LAB_00387835;
    }
    if (pCVar2->nIterLim + -1 <= pCVar5->nIter) {
      pcVar18 = "Iteration limit reached.";
      goto LAB_00387835;
    }
LAB_0038783a:
    if ((pCVar3->termCode == OPTIMAL) && (pCVar3->termIterate == AVERAGE_ITERATE)) {
      local_50 = 0x138;
      local_58 = 0x118;
      local_60 = 0x130;
      lVar22 = 0x128;
      lVar20 = 0x110;
      lVar16 = 0x108;
      goto LAB_003878b4;
    }
  }
  else {
    if (tVar19 == INFEASIBLE_OR_UNBOUNDED) {
      if (pCVar3->primalCode == FEASIBLE) {
        if (pCVar3->dualCode != INFEASIBLE) goto LAB_003877fb;
        pcVar18 = "Infeasible or unbounded: dual infeasible.";
      }
      else if ((pCVar3->primalCode == INFEASIBLE) && (pCVar3->dualCode == FEASIBLE)) {
        pcVar18 = "Infeasible or unbounded: primal infeasible.";
      }
      else {
LAB_003877fb:
        pcVar18 = "Infeasible or unbounded: both primal and dual infeasible.";
      }
      printf(pcVar18);
      if (pCVar3->termInfeasIterate == LAST_ITERATE) {
        pcVar18 = " [L]";
      }
      else {
        if (pCVar3->termInfeasIterate != AVERAGE_ITERATE) goto LAB_0038783a;
        pcVar18 = " [A]";
      }
LAB_00387835:
      puts(pcVar18);
      goto LAB_0038783a;
    }
    if (tVar19 != OPTIMAL) {
      pcVar18 = "Unexpected.";
      goto LAB_00387835;
    }
    if (pCVar3->termIterate == LAST_ITERATE) {
      pcVar18 = "Optimal current solution.";
      goto LAB_00387835;
    }
    if (pCVar3->termIterate == AVERAGE_ITERATE) {
      pcVar18 = "Optimal average solution.";
      goto LAB_00387835;
    }
  }
  local_50 = 0x38;
  local_58 = 0x18;
  local_60 = 0x30;
  lVar22 = 0x28;
  lVar20 = 0x10;
  lVar16 = 8;
LAB_003878b4:
  printf("%27s %+15.8e\n",*(undefined8 *)((long)&pCVar3->dFeasTol + lVar16),"Primal objective:");
  printf("%27s %+15.8e\n",*(undefined8 *)((long)&pCVar3->dFeasTol + lVar20),"Dual objective:");
  dVar23 = *(double *)((long)&pCVar3->dFeasTol + lVar22);
  printf("%27s %8.2e / %8.2e\n",dVar23,dVar23 / (pCVar6->dNormRhs + 1.0),"Primal infeas (abs/rel):")
  ;
  dVar23 = *(double *)((long)&pCVar3->dFeasTol + local_60);
  printf("%27s %8.2e / %8.2e\n",dVar23,dVar23 / (pCVar6->dNormCost + 1.0),"Dual infeas (abs/rel):");
  printf("%27s %8.2e / %8.2e\n",*(ulong *)((long)&pCVar3->dFeasTol + local_58) & 0x7fffffffffffffff,
         *(undefined8 *)((long)&pCVar3->dFeasTol + local_50),"Duality gap (abs/rel):");
  printf("%27s %d\n","Number of iterations:",(ulong)(uint)pCVar5->nIter);
  putchar(10);
  if (1 < pdhg->settings->nLogLevel) {
    puts("Timing information:");
    printf("%21s %e in %d iterations\n",
           pCVar5->dSolvingTime + pCVar5->dScalingTime + pCVar5->dPresolveTime,"Total solver time",
           (ulong)(uint)pCVar5->nIter);
    printf("%21s %e in %d iterations\n",pCVar5->dSolvingTime,"Solve time",(ulong)(uint)pCVar5->nIter
          );
    printf("%21s %e \n",(double)pCVar5->nIter / pCVar5->dSolvingTime,"Iters per sec");
    printf("%21s %e\n",pCVar5->dScalingTime,"Scaling time");
    printf("%21s %e\n",pCVar5->dPresolveTime,"Presolve time");
    printf("%21s %e in %d calls\n",pCVar5->dAxTime,"Ax",(ulong)(uint)pCVar5->nAxCalls);
    printf("%21s %e in %d calls\n",pCVar5->dAtyTime,"Aty",(ulong)(uint)pCVar5->nAtyCalls);
    printf("%21s %e in %d calls\n",pCVar5->dComputeResidualsTime,"ComputeResiduals",
           (ulong)(uint)pCVar5->nComputeResidualsCalls);
    printf("%21s %e in %d calls\n",pCVar5->dUpdateIterateTime,"UpdateIterates",
           (ulong)(uint)pCVar5->nUpdateIterateCalls);
  }
  return 0;
}

Assistant:

cupdlp_retcode PDHG_Solve(CUPDLPwork *pdhg) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPstepsize *stepsize = pdhg->stepsize;
  CUPDLPsettings *settings = pdhg->settings;
  CUPDLPresobj *resobj = pdhg->resobj;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPtimers *timers = pdhg->timers;
  CUPDLPscaling *scaling = pdhg->scaling;

  timers->nIter = 0;
  timers->dSolvingBeg = getTimeStamp();

  PDHG_Init_Data(pdhg);

  CUPDLP_CALL(PDHG_Init_Step_Sizes(pdhg));

  PDHG_Init_Variables(pdhg);

  // todo: translate check_data into cuda or do it on cpu
  // PDHG_Check_Data(pdhg);

  // PDHG_Print_Header(pdhg);

  // Repeat the iteration logging header periodically if logging style
  // is minimal (pdhg->settings->nLogLevel=1), initialising
  // iter_log_since_header so that an initial header is printed
  const int iter_log_between_header = 50;
  int iter_log_since_header = iter_log_between_header;
  for (timers->nIter = 0; timers->nIter < settings->nIterLim; ++timers->nIter) {
    PDHG_Compute_SolvingTime(pdhg);
#if CUPDLP_DUMP_ITERATES_STATS && CUPDLP_DEBUG
    PDHG_Dump_Stats(pdhg);
#endif
    int bool_checking = (timers->nIter < 10) ||
                        (timers->nIter == (settings->nIterLim - 1)) ||
                        (timers->dSolvingTime > settings->dTimeLim);
    int bool_print = 0;
#if CUPDLP_DEBUG
    bool_checking = (bool_checking || !(timers->nIter % CUPDLP_DEBUG_INTERVAL));
    bool_print = bool_checking;
#else
    bool_checking =
        (bool_checking || !(timers->nIter % CUPDLP_RELEASE_INTERVAL));
    bool_print =
        (bool_checking && !(timers->nIter % (CUPDLP_RELEASE_INTERVAL *
                                             settings->nLogInterval))) ||
        (timers->nIter == (settings->nIterLim - 1)) ||
        (timers->dSolvingTime > settings->dTimeLim);
    // Ensure that bool_print is false if the logging level has been
    // set to 0 via the HiGHS option
    bool_print = pdhg->settings->nLogLevel>0 && bool_print;
#endif
    // Full printing is false only if the logging level has been set
    // to 0 or 1 via the HiGHS option
    int full_print = pdhg->settings->nLogLevel >= 2;
    if (bool_checking) {
      PDHG_Compute_Average_Iterate(pdhg);
      PDHG_Compute_Residuals(pdhg);
      PDHG_Compute_Infeas_Residuals(pdhg);

      if (bool_print) {
	// With reduced printing, the header is only needed for the
	// first iteration since only average iteration printing is
	// carried out
        if (full_print ||
	    iter_log_since_header == iter_log_between_header) {
	  PDHG_Print_Header(pdhg);
	  iter_log_since_header = 0;
	}
        if (full_print) PDHG_Print_Iter(pdhg);
        PDHG_Print_Iter_Average(pdhg);
	iter_log_since_header++;
      }

      // Termination check printing is only done when printing is full
      int termination_print = bool_print && full_print;
      if (PDHG_Check_Termination(pdhg, termination_print)) {
        // cupdlp_printf("Optimal current solution.\n");
        resobj->termIterate = LAST_ITERATE;
        resobj->termCode = OPTIMAL;
        break;
      }

      // Don't allow "average" termination if
      // iInfNormAbsLocalTermination is set
      if (!pdhg->settings->iInfNormAbsLocalTermination &&
	  PDHG_Check_Termination_Average(pdhg, termination_print)) {
	// cupdlp_printf("Optimal average solution.\n");
	
    cupdlp_int iter = pdhg->timers->nIter;
    CUPDLPvec *x = iterates->x[iter % 2];
    CUPDLPvec *y = iterates->y[iter % 2];
    CUPDLPvec *ax = iterates->ax[iter % 2];
    CUPDLPvec *aty = iterates->aty[iter % 2];

    CUPDLP_COPY_VEC(x->data, iterates->xAverage->data, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(y->data, iterates->yAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(ax->data, iterates->axAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(aty->data, iterates->atyAverage->data, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(resobj->dSlackPos, resobj->dSlackPosAverage, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(resobj->dSlackNeg, resobj->dSlackNegAverage, cupdlp_float, problem->nCols);

	resobj->termIterate = AVERAGE_ITERATE;
	resobj->termCode = OPTIMAL;
	break;
      }

      if (PDHG_Check_Infeasibility(pdhg, 0) == INFEASIBLE_OR_UNBOUNDED) {
        // cupdlp_printf("Infeasible or unbounded.\n");
        // if (resobj->primalCode == INFEASIBLE && resobj->dualCode == FEASIBLE)
        // {
        //   resobj->dualCode = UNBOUNDED;
        // } else if (resobj->primalCode == FEASIBLE &&
        //            resobj->dualCode == INFEASIBLE) {
        //   resobj->primalCode = UNBOUNDED;
        // }
        // resobj->termCode = resobj->primalCode;
        resobj->termCode = INFEASIBLE_OR_UNBOUNDED;
        break;
      }

      if (timers->dSolvingTime > settings->dTimeLim) {
        // cupdlp_printf("Time limit reached.\n");
        resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
        break;
      }

      if (timers->nIter >= (settings->nIterLim - 1)) {
        // cupdlp_printf("Iteration limit reached.\n");
        resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
        break;
      }

      PDHG_Restart_Iterate(pdhg);
    }

    // CUPDLP_CALL(PDHG_Update_Iterate(pdhg));
    if (PDHG_Update_Iterate(pdhg) == RETCODE_FAILED) {
      // cupdlp_printf("Time limit reached.\n");
      resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
      break;
    }
  }

  // print at last
  if (pdhg->settings->nLogLevel>0) {
    int full_print = pdhg->settings->nLogLevel >= 2;
    if (full_print) {
      PDHG_Print_Header(pdhg);
      PDHG_Print_Iter(pdhg);
    }
    PDHG_Print_Iter_Average(pdhg);
  }

  if (pdhg->settings->nLogLevel>0) {
    cupdlp_printf("\n");
    cupdlp_printf("%-27s ", "Solving information:");

    switch (resobj->termCode) {
    case OPTIMAL:
      if (resobj->termIterate == LAST_ITERATE) {
        cupdlp_printf("Optimal current solution.\n");
      } else if (resobj->termIterate == AVERAGE_ITERATE) {
        cupdlp_printf("Optimal average solution.\n");
      }
      break;
    case TIMELIMIT_OR_ITERLIMIT:
      if (timers->dSolvingTime > settings->dTimeLim) {
        cupdlp_printf("Time limit reached.\n");
      } else if (timers->nIter >= (settings->nIterLim - 1)) {
        cupdlp_printf("Iteration limit reached.\n");
      }
      break;
    case INFEASIBLE_OR_UNBOUNDED:
      if (resobj->primalCode == INFEASIBLE && resobj->dualCode == FEASIBLE) {
        cupdlp_printf("Infeasible or unbounded: primal infeasible.");
      } else if (resobj->primalCode == FEASIBLE &&
                 resobj->dualCode == INFEASIBLE) {
        cupdlp_printf("Infeasible or unbounded: dual infeasible.");
      } else {
        cupdlp_printf(
		      "Infeasible or unbounded: both primal and dual infeasible.");
      }
      
      if (resobj->termInfeasIterate == LAST_ITERATE) {
        cupdlp_printf(" [L]\n");
      } else if (resobj->termInfeasIterate == AVERAGE_ITERATE) {
        cupdlp_printf(" [A]\n");
      }
      break;
    default:
      cupdlp_printf("Unexpected.\n");
      break;
    }

    if (resobj->termCode == OPTIMAL && resobj->termIterate == AVERAGE_ITERATE) {
      cupdlp_printf("%27s %+15.8e\n",
		    "Primal objective:", resobj->dPrimalObjAverage);
      cupdlp_printf("%27s %+15.8e\n", "Dual objective:", resobj->dDualObjAverage);
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Primal infeas (abs/rel):", resobj->dPrimalFeasAverage,
		    resobj->dPrimalFeasAverage / (1.0 + scaling->dNormRhs));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Dual infeas (abs/rel):", resobj->dDualFeasAverage,
		    resobj->dDualFeasAverage / (1.0 + scaling->dNormCost));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Duality gap (abs/rel):", fabs(resobj->dDualityGapAverage),
		    resobj->dRelObjGapAverage);
    } else {
      cupdlp_printf("%27s %+15.8e\n", "Primal objective:", resobj->dPrimalObj);
      cupdlp_printf("%27s %+15.8e\n", "Dual objective:", resobj->dDualObj);
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Primal infeas (abs/rel):", resobj->dPrimalFeas,
		    resobj->dPrimalFeas / (1.0 + scaling->dNormRhs));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Dual infeas (abs/rel):", resobj->dDualFeas,
		    resobj->dDualFeas / (1.0 + scaling->dNormCost));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Duality gap (abs/rel):", fabs(resobj->dDualityGap),
		    resobj->dRelObjGap);
    }
    cupdlp_printf("%27s %d\n", "Number of iterations:", timers->nIter);
    cupdlp_printf("\n");
  }

#if PDHG_USE_TIMERS
  if (pdhg->settings->nLogLevel>1) {
    cupdlp_printf("Timing information:\n");
    // cupdlp_printf("%21s %e in %d iterations\n", "Total solver time",
    //               timers->dSolvingTime, timers->nIter);
    cupdlp_printf(
		  "%21s %e in %d iterations\n", "Total solver time",
		  timers->dSolvingTime + timers->dScalingTime + timers->dPresolveTime,
		  timers->nIter);
    cupdlp_printf("%21s %e in %d iterations\n", "Solve time",
		  timers->dSolvingTime, timers->nIter);
    cupdlp_printf("%21s %e \n", "Iters per sec",
		  timers->nIter / timers->dSolvingTime);
    cupdlp_printf("%21s %e\n", "Scaling time", timers->dScalingTime);
    cupdlp_printf("%21s %e\n", "Presolve time", timers->dPresolveTime);
    cupdlp_printf("%21s %e in %d calls\n", "Ax", timers->dAxTime,
		  timers->nAxCalls);
    cupdlp_printf("%21s %e in %d calls\n", "Aty", timers->dAtyTime,
		  timers->nAtyCalls);
    cupdlp_printf("%21s %e in %d calls\n", "ComputeResiduals",
		  timers->dComputeResidualsTime, timers->nComputeResidualsCalls);
    cupdlp_printf("%21s %e in %d calls\n", "UpdateIterates",
		  timers->dUpdateIterateTime, timers->nUpdateIterateCalls);
  }
#endif

#ifndef CUPDLP_CPU
  if (pdhg->settings->nLogLevel>0) {
    cupdlp_printf("\n");
    cupdlp_printf("GPU Timing information:\n");
    cupdlp_printf("%21s %e\n", "CudaPrepare", timers->CudaPrepareTime);
    cupdlp_printf("%21s %e\n", "Alloc&CopyMatToDevice",
		  timers->AllocMem_CopyMatToDeviceTime);
    cupdlp_printf("%21s %e\n", "CopyVecToDevice", timers->CopyVecToDeviceTime);
    cupdlp_printf("%21s %e\n", "DeviceMatVecProd", timers->DeviceMatVecProdTime);
    cupdlp_printf("%21s %e\n\n", "CopyVecToHost", timers->CopyVecToHostTime);
  }
#endif

exit_cleanup:
  return retcode;
}